

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O1

int run_test_pipe_bind_error_addrnotavail(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *__s;
  undefined8 unaff_RBX;
  long *plVar3;
  code **ppcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t server;
  code *pcStack_1098;
  long lStack_1090;
  long lStack_1088;
  long alStack_1080 [13];
  undefined1 auStack_1018 [232];
  long alStack_f30 [64];
  code *pcStack_d30;
  long lStack_d20;
  long lStack_d18;
  undefined1 auStack_d10 [232];
  code *pcStack_c28;
  long lStack_c18;
  long lStack_c10;
  undefined1 auStack_c08 [232];
  undefined1 auStack_b20 [2047];
  undefined1 uStack_321;
  code *pcStack_320;
  long lStack_310;
  long lStack_308;
  undefined1 auStack_300 [232];
  code *pcStack_218;
  long lStack_208;
  long lStack_200;
  undefined1 auStack_1f8 [232];
  code *pcStack_110;
  long local_100;
  long local_f8;
  undefined1 local_f0 [232];
  
  pcStack_110 = (code *)0x1b00d4;
  uVar2 = uv_default_loop();
  pcStack_110 = (code *)0x1b00e3;
  iVar1 = uv_pipe_init(uVar2,local_f0,0);
  local_f8 = (long)iVar1;
  local_100 = 0;
  if (local_f8 == 0) {
    pcStack_110 = (code *)0x1b0114;
    iVar1 = uv_pipe_bind(local_f0,"/path/to/unix/socket/that/really/should/not/be/there");
    local_f8 = (long)iVar1;
    local_100 = -0xd;
    if (local_f8 != -0xd) goto LAB_001b01e0;
    pcStack_110 = (code *)0x1b0145;
    uv_close(local_f0,close_cb);
    pcStack_110 = (code *)0x1b014a;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1b0154;
    uv_run(uVar2,0);
    local_f8 = 1;
    local_100 = (long)close_cb_called;
    if (local_100 != 1) goto LAB_001b01ef;
    pcStack_110 = (code *)0x1b017a;
    unaff_RBX = uv_default_loop();
    pcStack_110 = (code *)0x1b018e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_110 = (code *)0x1b0198;
    uv_run(unaff_RBX,0);
    local_f8 = 0;
    pcStack_110 = (code *)0x1b01a6;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1b01ae;
    iVar1 = uv_loop_close(uVar2);
    local_100 = (long)iVar1;
    if (local_f8 == local_100) {
      pcStack_110 = (code *)0x1b01c6;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_110 = (code *)0x1b01e0;
    run_test_pipe_bind_error_addrnotavail_cold_1();
LAB_001b01e0:
    pcStack_110 = (code *)0x1b01ef;
    run_test_pipe_bind_error_addrnotavail_cold_2();
LAB_001b01ef:
    pcStack_110 = (code *)0x1b01fe;
    run_test_pipe_bind_error_addrnotavail_cold_3();
  }
  pcStack_110 = run_test_pipe_bind_error_inval;
  run_test_pipe_bind_error_addrnotavail_cold_4();
  pcStack_218 = (code *)0x1b021a;
  pcStack_110 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_218 = (code *)0x1b0229;
  iVar1 = uv_pipe_init(uVar2,auStack_1f8,0);
  lStack_200 = (long)iVar1;
  lStack_208 = 0;
  if (lStack_200 == 0) {
    pcStack_218 = (code *)0x1b025a;
    iVar1 = uv_pipe_bind(auStack_1f8,"/tmp/uv-test-sock");
    lStack_200 = (long)iVar1;
    lStack_208 = 0;
    if (lStack_200 != 0) goto LAB_001b035b;
    pcStack_218 = (code *)0x1b028b;
    iVar1 = uv_pipe_bind(auStack_1f8,"/tmp/uv-test-sock2");
    lStack_200 = (long)iVar1;
    lStack_208 = -0x16;
    if (lStack_200 != -0x16) goto LAB_001b036a;
    pcStack_218 = (code *)0x1b02bc;
    uv_close(auStack_1f8,close_cb);
    pcStack_218 = (code *)0x1b02c1;
    uVar2 = uv_default_loop();
    pcStack_218 = (code *)0x1b02cb;
    uv_run(uVar2,0);
    lStack_200 = 1;
    lStack_208 = (long)close_cb_called;
    if (lStack_208 != 1) goto LAB_001b0379;
    pcStack_218 = (code *)0x1b02f5;
    unaff_RBX = uv_default_loop();
    pcStack_218 = (code *)0x1b0309;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_218 = (code *)0x1b0313;
    uv_run(unaff_RBX,0);
    lStack_200 = 0;
    pcStack_218 = (code *)0x1b0321;
    uVar2 = uv_default_loop();
    pcStack_218 = (code *)0x1b0329;
    iVar1 = uv_loop_close(uVar2);
    lStack_208 = (long)iVar1;
    if (lStack_200 == lStack_208) {
      pcStack_218 = (code *)0x1b0341;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_218 = (code *)0x1b035b;
    run_test_pipe_bind_error_inval_cold_1();
LAB_001b035b:
    pcStack_218 = (code *)0x1b036a;
    run_test_pipe_bind_error_inval_cold_2();
LAB_001b036a:
    pcStack_218 = (code *)0x1b0379;
    run_test_pipe_bind_error_inval_cold_3();
LAB_001b0379:
    pcStack_218 = (code *)0x1b0388;
    run_test_pipe_bind_error_inval_cold_4();
  }
  pcStack_218 = run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  pcStack_320 = (code *)0x1b03a4;
  pcStack_218 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_320 = (code *)0x1b03b3;
  iVar1 = uv_pipe_init(uVar2,auStack_300,0);
  lStack_308 = (long)iVar1;
  lStack_310 = 0;
  if (lStack_308 == 0) {
    pcStack_320 = (code *)0x1b03e4;
    iVar1 = uv_listen(auStack_300,0x1000,0);
    lStack_308 = (long)iVar1;
    lStack_310 = -0x16;
    if (lStack_308 != -0x16) goto LAB_001b04b0;
    pcStack_320 = (code *)0x1b0415;
    uv_close(auStack_300,close_cb);
    pcStack_320 = (code *)0x1b041a;
    uVar2 = uv_default_loop();
    pcStack_320 = (code *)0x1b0424;
    uv_run(uVar2,0);
    lStack_308 = 1;
    lStack_310 = (long)close_cb_called;
    if (lStack_310 != 1) goto LAB_001b04bf;
    pcStack_320 = (code *)0x1b044a;
    unaff_RBX = uv_default_loop();
    pcStack_320 = (code *)0x1b045e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_320 = (code *)0x1b0468;
    uv_run(unaff_RBX,0);
    lStack_308 = 0;
    pcStack_320 = (code *)0x1b0476;
    uVar2 = uv_default_loop();
    pcStack_320 = (code *)0x1b047e;
    iVar1 = uv_loop_close(uVar2);
    lStack_310 = (long)iVar1;
    if (lStack_308 == lStack_310) {
      pcStack_320 = (code *)0x1b0496;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_320 = (code *)0x1b04b0;
    run_test_pipe_listen_without_bind_cold_1();
LAB_001b04b0:
    pcStack_320 = (code *)0x1b04bf;
    run_test_pipe_listen_without_bind_cold_2();
LAB_001b04bf:
    pcStack_320 = (code *)0x1b04ce;
    run_test_pipe_listen_without_bind_cold_3();
  }
  pcStack_320 = run_test_pipe_bind_error_long_path;
  run_test_pipe_listen_without_bind_cold_4();
  __s = auStack_b20;
  pcStack_c28 = (code *)0x1b04ff;
  pcStack_320 = (code *)unaff_RBX;
  memset(__s,0x2e,0x7ff);
  uStack_321 = 0;
  pcStack_c28 = (code *)0x1b050b;
  uVar2 = uv_default_loop();
  pcStack_c28 = (code *)0x1b051a;
  iVar1 = uv_pipe_init(uVar2,auStack_c08,0);
  if (iVar1 == 0) {
    pcStack_c28 = (code *)0x1b0534;
    iVar1 = uv_pipe_bind(auStack_c08,auStack_b20);
    if (iVar1 != -0x24) goto LAB_001b05c7;
    pcStack_c28 = (code *)0x1b054e;
    uv_close(auStack_c08,close_cb);
    pcStack_c28 = (code *)0x1b0553;
    uVar2 = uv_default_loop();
    pcStack_c28 = (code *)0x1b055d;
    uv_run(uVar2,0);
    if (close_cb_called != 1) goto LAB_001b05cc;
    pcStack_c28 = (code *)0x1b056b;
    __s = (undefined1 *)uv_default_loop();
    pcStack_c28 = (code *)0x1b057f;
    uv_walk(__s,close_walk_cb,0);
    pcStack_c28 = (code *)0x1b0589;
    uv_run(__s,0);
    lStack_c10 = 0;
    pcStack_c28 = (code *)0x1b0597;
    uVar2 = uv_default_loop();
    pcStack_c28 = (code *)0x1b059f;
    iVar1 = uv_loop_close(uVar2);
    lStack_c18 = (long)iVar1;
    if (lStack_c10 == lStack_c18) {
      pcStack_c28 = (code *)0x1b05b7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_c28 = (code *)0x1b05c7;
    run_test_pipe_bind_error_long_path_cold_1();
LAB_001b05c7:
    pcStack_c28 = (code *)0x1b05cc;
    run_test_pipe_bind_error_long_path_cold_2();
LAB_001b05cc:
    pcStack_c28 = (code *)0x1b05d1;
    run_test_pipe_bind_error_long_path_cold_3();
  }
  pcStack_c28 = run_test_pipe_bind_or_listen_error_after_close;
  run_test_pipe_bind_error_long_path_cold_4();
  pcStack_d30 = (code *)0x1b05ed;
  pcStack_c28 = (code *)__s;
  uVar2 = uv_default_loop();
  pcStack_d30 = (code *)0x1b05fc;
  iVar1 = uv_pipe_init(uVar2,auStack_d10,0);
  lStack_d18 = (long)iVar1;
  lStack_d20 = 0;
  if (lStack_d18 == 0) {
    __s = auStack_d10;
    pcStack_d30 = (code *)0x1b062b;
    uv_close(__s,0);
    pcStack_d30 = (code *)0x1b063a;
    iVar1 = uv_pipe_bind(__s,"/tmp/uv-test-sock");
    lStack_d18 = (long)iVar1;
    lStack_d20 = -0x16;
    if (lStack_d18 != -0x16) goto LAB_001b0725;
    pcStack_d30 = (code *)0x1b066b;
    iVar1 = uv_listen(auStack_d10,0x1000,0);
    lStack_d18 = (long)iVar1;
    lStack_d20 = -0x16;
    if (lStack_d18 != -0x16) goto LAB_001b0734;
    pcStack_d30 = (code *)0x1b0690;
    uVar2 = uv_default_loop();
    pcStack_d30 = (code *)0x1b069a;
    iVar1 = uv_run(uVar2,0);
    lStack_d18 = (long)iVar1;
    lStack_d20 = 0;
    if (lStack_d18 != 0) goto LAB_001b0743;
    pcStack_d30 = (code *)0x1b06bf;
    __s = (undefined1 *)uv_default_loop();
    pcStack_d30 = (code *)0x1b06d3;
    uv_walk(__s,close_walk_cb,0);
    pcStack_d30 = (code *)0x1b06dd;
    uv_run(__s,0);
    lStack_d18 = 0;
    pcStack_d30 = (code *)0x1b06eb;
    uVar2 = uv_default_loop();
    pcStack_d30 = (code *)0x1b06f3;
    iVar1 = uv_loop_close(uVar2);
    lStack_d20 = (long)iVar1;
    if (lStack_d18 == lStack_d20) {
      pcStack_d30 = (code *)0x1b070b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_d30 = (code *)0x1b0725;
    run_test_pipe_bind_or_listen_error_after_close_cold_1();
LAB_001b0725:
    pcStack_d30 = (code *)0x1b0734;
    run_test_pipe_bind_or_listen_error_after_close_cold_2();
LAB_001b0734:
    pcStack_d30 = (code *)0x1b0743;
    run_test_pipe_bind_or_listen_error_after_close_cold_3();
LAB_001b0743:
    pcStack_d30 = (code *)0x1b0752;
    run_test_pipe_bind_or_listen_error_after_close_cold_4();
  }
  pcStack_d30 = run_test_pipe_overlong_path;
  run_test_pipe_bind_or_listen_error_after_close_cold_5();
  plVar3 = &lStack_1090;
  pcStack_1098 = (code *)0x1b076e;
  pcStack_d30 = (code *)__s;
  uVar2 = uv_default_loop();
  pcStack_1098 = (code *)0x1b077d;
  iVar1 = uv_pipe_init(uVar2,auStack_1018,0);
  alStack_f30[0] = (long)iVar1;
  alStack_1080[0] = 0;
  if (alStack_f30[0] == 0) {
    pcStack_1098 = (code *)0x1b07bd;
    memset(alStack_f30,0x40,0x200);
    alStack_1080[0] = -0x24;
    pcStack_1098 = (code *)0x1b07dd;
    iVar1 = uv_pipe_bind2(auStack_1018,alStack_f30,0x200,1);
    lStack_1090 = (long)iVar1;
    if (alStack_1080[0] != lStack_1090) goto LAB_001b0991;
    lStack_1090 = -0x24;
    pcStack_1098 = (code *)0x1b0823;
    iVar1 = uv_pipe_connect2(alStack_1080,auStack_1018,alStack_f30,0x200,1,abort);
    lStack_1088 = (long)iVar1;
    if (lStack_1090 != lStack_1088) goto LAB_001b099e;
    pcStack_1098 = (code *)0x1b083e;
    uVar2 = uv_default_loop();
    pcStack_1098 = (code *)0x1b0848;
    iVar1 = uv_run(uVar2,0);
    lStack_1090 = (long)iVar1;
    lStack_1088 = 0;
    if (lStack_1090 != 0) goto LAB_001b09ab;
    lStack_1090 = -0x16;
    pcStack_1098 = (code *)0x1b087f;
    iVar1 = uv_pipe_bind(auStack_1018,"");
    lStack_1088 = (long)iVar1;
    if (lStack_1090 != lStack_1088) goto LAB_001b09b8;
    pcStack_1098 = (code *)0x1b08b2;
    uv_pipe_connect(alStack_1080,auStack_1018,"",connect_overlong_cb);
    pcStack_1098 = (code *)0x1b08b7;
    uVar2 = uv_default_loop();
    pcStack_1098 = (code *)0x1b08c1;
    iVar1 = uv_run(uVar2,0);
    lStack_1090 = (long)iVar1;
    lStack_1088 = 0;
    if (lStack_1090 != 0) goto LAB_001b09c5;
    lStack_1090 = 1;
    lStack_1088 = (long)connect_cb_called;
    if (lStack_1088 != 1) goto LAB_001b09d2;
    lStack_1090 = 1;
    lStack_1088 = (long)close_cb_called;
    if (lStack_1088 == 1) {
      pcStack_1098 = (code *)0x1b092a;
      uVar2 = uv_default_loop();
      pcStack_1098 = (code *)0x1b093e;
      uv_walk(uVar2,close_walk_cb,0);
      pcStack_1098 = (code *)0x1b0948;
      uv_run(uVar2,0);
      lStack_1090 = 0;
      pcStack_1098 = (code *)0x1b0955;
      uVar2 = uv_default_loop();
      pcStack_1098 = (code *)0x1b095d;
      iVar1 = uv_loop_close(uVar2);
      lStack_1088 = (long)iVar1;
      if (lStack_1090 == lStack_1088) {
        pcStack_1098 = (code *)0x1b0974;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b09ec;
    }
  }
  else {
    pcStack_1098 = (code *)0x1b0991;
    run_test_pipe_overlong_path_cold_1();
LAB_001b0991:
    pcStack_1098 = (code *)0x1b099e;
    run_test_pipe_overlong_path_cold_2();
LAB_001b099e:
    pcStack_1098 = (code *)0x1b09ab;
    run_test_pipe_overlong_path_cold_3();
LAB_001b09ab:
    pcStack_1098 = (code *)0x1b09b8;
    run_test_pipe_overlong_path_cold_4();
LAB_001b09b8:
    pcStack_1098 = (code *)0x1b09c5;
    run_test_pipe_overlong_path_cold_5();
LAB_001b09c5:
    pcStack_1098 = (code *)0x1b09d2;
    run_test_pipe_overlong_path_cold_6();
LAB_001b09d2:
    pcStack_1098 = (code *)0x1b09df;
    run_test_pipe_overlong_path_cold_7();
  }
  pcStack_1098 = (code *)0x1b09ec;
  run_test_pipe_overlong_path_cold_8();
LAB_001b09ec:
  iVar1 = (int)&lStack_1088;
  pcStack_1098 = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  pcStack_1098 = (code *)(long)iVar1;
  if (pcStack_1098 == (code *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    iVar1 = uv_close(*(undefined8 *)((long)plVar3 + 0x50),close_cb);
    return iVar1;
  }
  ppcVar4 = &pcStack_1098;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(ppcVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_bind_error_addrnotavail) {
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&server, BAD_PIPENAME);
  ASSERT_EQ(r, UV_EACCES);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}